

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.h
# Opt level: O3

bool __thiscall
QSQLiteDriver::isIdentifierEscaped(QSQLiteDriver *this,QString *identifier,IdentifierType type)

{
  char16_t cVar1;
  ulong uVar2;
  char16_t *pcVar3;
  
  uVar2 = (identifier->d).size;
  if (uVar2 < 3) {
    return false;
  }
  pcVar3 = (identifier->d).ptr;
  cVar1 = *pcVar3;
  if (cVar1 == L'`') {
    if (pcVar3[uVar2 - 1] != L'`') {
      return false;
    }
  }
  else {
    if (cVar1 == L'[') {
      return pcVar3[uVar2 - 1] == L']';
    }
    if (cVar1 != L'\"') {
      return false;
    }
    if (pcVar3[uVar2 - 1] != L'\"') {
      return false;
    }
  }
  return true;
}

Assistant:

constexpr qsizetype size() const noexcept
    {
#if __has_cpp_attribute(assume)
        constexpr size_t MaxSize = maxSize();
        [[assume(size_t(d.size) <= MaxSize)]];
#endif
        return d.size;
    }